

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature_algorithm_unittest.cc
# Opt level: O2

void __thiscall
bssl::anon_unknown_0::SignatureAlgorithmTest_ParseDerRsaPssUnsupportedHashOid_Test::TestBody
          (SignatureAlgorithmTest_ParseDerRsaPssUnsupportedHashOid_Test *this)

{
  optional<bssl::SignatureAlgorithm> oVar1;
  char *in_R9;
  Input algorithm_identifier;
  AssertHelper AStack_78;
  Message local_70;
  string local_68;
  AssertionResult gtest_ar_;
  uint8_t kData [30];
  
  kData[0x10] = '\r';
  kData[0x11] = '0';
  kData[0x12] = '\v';
  kData[0x13] = '\x06';
  kData[0x14] = '\t';
  kData[0x15] = '`';
  kData[0x16] = 0x86;
  kData[0x17] = 'H';
  kData[0x18] = '\x02';
  kData[0x19] = 'g';
  kData[0x1a] = '\x13';
  kData[0x1b] = '\x04';
  kData[0x1c] = '\x02';
  kData[0x1d] = '\x02';
  kData[0] = '0';
  kData[1] = '\x1c';
  kData[2] = '\x06';
  kData[3] = '\t';
  kData[4] = '*';
  kData[5] = 0x86;
  kData[6] = 'H';
  kData[7] = 0x86;
  kData[8] = 0xf7;
  kData[9] = '\r';
  kData[10] = '\x01';
  kData[0xb] = '\x01';
  kData[0xc] = '\n';
  kData[0xd] = '0';
  kData[0xe] = '\x0f';
  kData[0xf] = 0xa0;
  algorithm_identifier.data_.size_ = 0x1e;
  algorithm_identifier.data_.data_ = kData;
  oVar1 = ParseSignatureAlgorithm(algorithm_identifier);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ =
       ((ulong)oVar1.super__Optional_base<bssl::SignatureAlgorithm,_true,_true>._M_payload.
               super__Optional_payload_base<bssl::SignatureAlgorithm> >> 0x20 & 1) == 0;
  if (!gtest_ar_.success_) {
    testing::Message::Message(&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)&gtest_ar_,
               (AssertionResult *)"ParseSignatureAlgorithm(der::Input(kData))","true","false",in_R9)
    ;
    testing::internal::AssertHelper::AssertHelper
              (&AStack_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/signature_algorithm_unittest.cc"
               ,0x2be,local_68._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&AStack_78);
    ::std::__cxx11::string::~string((string *)&local_68);
    if (local_70.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)local_70.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  ::std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  return;
}

Assistant:

TEST(SignatureAlgorithmTest, ParseDerRsaPssUnsupportedHashOid) {
  // clang-format off
  const uint8_t kData[] = {
      0x30, 0x1C,  // SEQUENCE (28 bytes)
      0x06, 0x09,  // OBJECT IDENTIFIER (9 bytes)
      0x2A, 0x86, 0x48, 0x86, 0xF7, 0x0D, 0x01, 0x01, 0x0A,
      0x30, 0x0F,  // SEQUENCE (15 bytes)
      0xA0, 0x0D,  // [0] (13 bytes)
      0x30, 0x0B,  // SEQUENCE (11 bytes)
      0x06, 0x09,  // OBJECT IDENTIFIER (9 bytes)
      0x60, 0x86, 0x48, 0x02, 0x67, 0x13, 0x04, 0x02, 0x02,
  };
  // clang-format on
  EXPECT_FALSE(ParseSignatureAlgorithm(der::Input(kData)));
}